

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool el::Loggers::hasLogger(string *identity)

{
  bool bVar1;
  
  bVar1 = base::RegisteredLoggers::has(*(RegisteredLoggers **)(base::elStorage + 0x10),identity);
  return bVar1;
}

Assistant:

bool Loggers::hasLogger(const std::string& identity) {
  return ELPP->registeredLoggers()->has(identity);
}